

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOService.cpp
# Opt level: O1

void anon_unknown.dwarf_638344::handle_io<curious_metadata_record>
               (curious_callback_type_t type,void *usr_data,curious_metadata_record *record)

{
  bool bVar1;
  Caliper c;
  Variant mount_point_var;
  Variant filesystem_var;
  Caliper local_60;
  cali_variant_t local_40;
  cali_variant_t local_30;
  
  (anonymous_namespace)::num_io_callbacks = (anonymous_namespace)::num_io_callbacks + 1;
  cali::Caliper::sigsafe_instance();
  bVar1 = cali::Caliper::operator_cast_to_bool(&local_60);
  if ((bVar1) && (bVar1 = cali::Channel::is_active((Channel *)((long)usr_data + 8)), bVar1)) {
    if ((type & 1U) == 0) {
      local_30 = (cali_variant_t)make_variant(record->filesystem);
      local_40 = (cali_variant_t)make_variant(record->mount_point);
      cali::Caliper::begin
                (&local_60,(Attribute *)&(anonymous_namespace)::io_mount_point_attr,
                 (Variant *)&local_40);
      cali::Caliper::begin
                (&local_60,(Attribute *)&(anonymous_namespace)::io_filesystem_attr,
                 (Variant *)&local_30);
      cali::Caliper::begin
                (&local_60,(Attribute *)&(anonymous_namespace)::io_region_attr,
                 (Variant *)((anonymous_namespace)::categories + (long)(type >> 1) * 0x10));
      return;
    }
    cali::Caliper::end(&local_60,(Attribute *)&(anonymous_namespace)::io_region_attr);
    cali::Caliper::end(&local_60,(Attribute *)&(anonymous_namespace)::io_filesystem_attr);
    cali::Caliper::end(&local_60,(Attribute *)&(anonymous_namespace)::io_mount_point_attr);
    return;
  }
  (anonymous_namespace)::num_failed_io_callbacks =
       (anonymous_namespace)::num_failed_io_callbacks + 1;
  return;
}

Assistant:

void handle_io(curious_callback_type_t type, void* usr_data, Record* record)
{
    ++num_io_callbacks;

    // get a Caliper instance

    Caliper c    = Caliper::sigsafe_instance();
    auto    data = static_cast<user_data_t*>(usr_data);

    // If we got a Caliper instance successfully...
    if (c && data->channel.is_active()) {
        // ...mark the end...
        if (type & CURIOUS_POST_CALLBACK) {
            handle_unique_record_data(c, data->channel, record);

            c.end(io_region_attr);
            c.end(io_filesystem_attr);
            c.end(io_mount_point_attr);

            // ...or begining of the I/O region, as appropriate
        } else {
            Variant filesystem_var  = make_variant(record->filesystem);
            Variant mount_point_var = make_variant(record->mount_point);

            c.begin(io_mount_point_attr, mount_point_var);
            c.begin(io_filesystem_attr, filesystem_var);
            c.begin(io_region_attr, categories[GET_CATEGORY(type)]);
        }

        // ...otherwise not our failure (probably already inside Caliper)
    } else {
        ++num_failed_io_callbacks;
    }
}